

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineResourceSignatureBase.cpp
# Opt level: O1

void Diligent::CopyPipelineResourceSignatureDesc
               (FixedLinearAllocator *Allocator,PipelineResourceSignatureDesc *SrcDesc,
               PipelineResourceSignatureDesc *DstDesc,array<unsigned_short,_4UL> *ResourceOffsets)

{
  PipelineResourceDesc *pPVar1;
  ImmutableSamplerDesc *pIVar2;
  undefined8 uVar3;
  FixedLinearAllocator *this;
  PipelineResourceSignatureDesc *pPVar4;
  unsigned_short uVar5;
  PipelineResourceDesc *__seed;
  ImmutableSamplerDesc *pIVar6;
  Char *pCVar7;
  char *pcVar8;
  array<unsigned_short,_4UL> *Args_1;
  long lVar9;
  long lVar10;
  ulong uVar11;
  undefined8 *puVar12;
  undefined8 *puVar13;
  ulong uVar14;
  byte bVar15;
  string msg;
  string local_60;
  FixedLinearAllocator *local_40;
  PipelineResourceSignatureDesc *local_38;
  
  bVar15 = 0;
  Args_1 = ResourceOffsets;
  __seed = FixedLinearAllocator::ConstructArray<Diligent::PipelineResourceDesc>
                     (Allocator,(ulong)SrcDesc->NumResources);
  local_40 = Allocator;
  pIVar6 = FixedLinearAllocator::ConstructArray<Diligent::ImmutableSamplerDesc>
                     (Allocator,(ulong)SrcDesc->NumImmutableSamplers);
  uVar11 = (ulong)SrcDesc->NumResources;
  local_38 = DstDesc;
  if (SrcDesc->NumResources != 0) {
    lVar10 = 0;
    uVar14 = 0;
    do {
      pPVar1 = SrcDesc->Resources;
      *(undefined8 *)(&__seed->ResourceType + lVar10) =
           *(undefined8 *)(&pPVar1->ResourceType + lVar10);
      puVar13 = (undefined8 *)((long)&pPVar1->Name + lVar10);
      uVar3 = puVar13[1];
      puVar12 = (undefined8 *)((long)&__seed->Name + lVar10);
      *puVar12 = *puVar13;
      puVar12[1] = uVar3;
      pcVar8 = *(char **)((long)&pPVar1->Name + lVar10);
      if ((pcVar8 == (char *)0x0) || (*pcVar8 == '\0')) {
        FormatString<char[26],char[49]>
                  (&local_60,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])"SrcRes.Name != nullptr && SrcRes.Name[0] != \'\\0\'",
                   (char (*) [49])Args_1);
        Args_1 = (array<unsigned_short,_4UL> *)0x1db;
        DebugAssertionFailed
                  (local_60._M_dataplus._M_p,"CopyPipelineResourceSignatureDesc",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineResourceSignatureBase.cpp"
                   ,0x1db);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._M_dataplus._M_p != &local_60.field_2) {
          operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
        }
      }
      pCVar7 = FixedLinearAllocator::CopyString(local_40,*(char **)((long)&pPVar1->Name + lVar10),0)
      ;
      *(Char **)((long)&__seed->Name + lVar10) = pCVar7;
      ResourceOffsets->_M_elems[(ulong)(&__seed->VarType)[lVar10] + 1] =
           ResourceOffsets->_M_elems[(ulong)(&__seed->VarType)[lVar10] + 1] + 1;
      uVar14 = uVar14 + 1;
      uVar11 = (ulong)SrcDesc->NumResources;
      lVar10 = lVar10 + 0x18;
    } while (uVar14 < uVar11);
  }
  if ((int)uVar11 != 0) {
    std::_Temporary_buffer<Diligent::PipelineResourceDesc_*,_Diligent::PipelineResourceDesc>::
    _Temporary_buffer((_Temporary_buffer<Diligent::PipelineResourceDesc_*,_Diligent::PipelineResourceDesc>
                       *)&local_60,__seed,uVar11 + 1 >> 1);
    if ((void *)local_60.field_2._M_allocated_capacity == (void *)0x0) {
      std::
      __inplace_stable_sort<Diligent::PipelineResourceDesc*,__gnu_cxx::__ops::_Iter_comp_iter<Diligent::CopyPipelineResourceSignatureDesc(Diligent::FixedLinearAllocator&,Diligent::PipelineResourceSignatureDesc_const&,Diligent::PipelineResourceSignatureDesc&,std::array<unsigned_short,4ul>&)::__0>>
                (__seed,__seed + uVar11);
    }
    else {
      std::
      __stable_sort_adaptive<Diligent::PipelineResourceDesc*,Diligent::PipelineResourceDesc*,long,__gnu_cxx::__ops::_Iter_comp_iter<Diligent::CopyPipelineResourceSignatureDesc(Diligent::FixedLinearAllocator&,Diligent::PipelineResourceSignatureDesc_const&,Diligent::PipelineResourceSignatureDesc&,std::array<unsigned_short,4ul>&)::__0>>
                (__seed,__seed + uVar11,local_60.field_2._M_allocated_capacity,
                 local_60._M_string_length);
    }
    operator_delete((void *)local_60.field_2._M_allocated_capacity,local_60._M_string_length * 0x18)
    ;
  }
  uVar5 = ResourceOffsets->_M_elems[0];
  lVar10 = 1;
  do {
    uVar5 = uVar5 + ResourceOffsets->_M_elems[lVar10];
    ResourceOffsets->_M_elems[lVar10] = uVar5;
    lVar10 = lVar10 + 1;
  } while (lVar10 != 4);
  if (SrcDesc->NumImmutableSamplers != 0) {
    lVar10 = 0x10;
    uVar11 = 0;
    do {
      pIVar2 = SrcDesc->ImmutableSamplers;
      puVar12 = (undefined8 *)((long)(pIVar2->Desc).BorderColor + lVar10 + -0x3c);
      puVar13 = (undefined8 *)((long)(pIVar6->Desc).BorderColor + lVar10 + -0x3c);
      for (lVar9 = 9; lVar9 != 0; lVar9 = lVar9 + -1) {
        *puVar13 = *puVar12;
        puVar12 = puVar12 + (ulong)bVar15 * -2 + 1;
        puVar13 = puVar13 + (ulong)bVar15 * -2 + 1;
      }
      pcVar8 = *(char **)((long)(pIVar2->Desc).BorderColor + lVar10 + -0x34);
      if ((pcVar8 == (char *)0x0) || (*pcVar8 == '\0')) {
        FormatString<char[26],char[81]>
                  (&local_60,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])
                   "SrcSam.SamplerOrTextureName != nullptr && SrcSam.SamplerOrTextureName[0] != \'\\0\'"
                   ,(char (*) [81])0x0);
        DebugAssertionFailed
                  (local_60._M_dataplus._M_p,"CopyPipelineResourceSignatureDesc",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineResourceSignatureBase.cpp"
                   ,0x1f6);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._M_dataplus._M_p != &local_60.field_2) {
          operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
        }
      }
      this = local_40;
      pCVar7 = FixedLinearAllocator::CopyString
                         (local_40,*(char **)((long)(pIVar2->Desc).BorderColor + lVar10 + -0x34),0);
      *(Char **)((long)(pIVar6->Desc).BorderColor + lVar10 + -0x34) = pCVar7;
      pcVar8 = FixedLinearAllocator::CopyString
                         (this,*(char **)((long)(pIVar2->Desc).BorderColor + lVar10 + -0x2c),0);
      if (pcVar8 == (Char *)0x0) {
        pcVar8 = "";
      }
      *(char **)((long)(pIVar6->Desc).BorderColor + lVar10 + -0x2c) = pcVar8;
      uVar11 = uVar11 + 1;
      lVar10 = lVar10 + 0x48;
    } while (uVar11 < SrcDesc->NumImmutableSamplers);
  }
  pPVar4 = local_38;
  local_38->Resources = __seed;
  local_38->ImmutableSamplers = pIVar6;
  if (SrcDesc->UseCombinedTextureSamplers != false) {
    pCVar7 = FixedLinearAllocator::CopyString(local_40,SrcDesc->CombinedSamplerSuffix,0);
    pPVar4->CombinedSamplerSuffix = pCVar7;
  }
  return;
}

Assistant:

void CopyPipelineResourceSignatureDesc(FixedLinearAllocator&                                            Allocator,
                                       const PipelineResourceSignatureDesc&                             SrcDesc,
                                       PipelineResourceSignatureDesc&                                   DstDesc,
                                       std::array<Uint16, SHADER_RESOURCE_VARIABLE_TYPE_NUM_TYPES + 1>& ResourceOffsets)
{
    PipelineResourceDesc* pResources = Allocator.ConstructArray<PipelineResourceDesc>(SrcDesc.NumResources);
    ImmutableSamplerDesc* pSamplers  = Allocator.ConstructArray<ImmutableSamplerDesc>(SrcDesc.NumImmutableSamplers);

    for (Uint32 i = 0; i < SrcDesc.NumResources; ++i)
    {
        const PipelineResourceDesc& SrcRes = SrcDesc.Resources[i];
        PipelineResourceDesc&       DstRes = pResources[i];

        DstRes = SrcRes;
        VERIFY_EXPR(SrcRes.Name != nullptr && SrcRes.Name[0] != '\0');
        DstRes.Name = Allocator.CopyString(SrcRes.Name);

        ++ResourceOffsets[size_t{DstRes.VarType} + 1];
    }

    // Sort resources by variable type (all static -> all mutable -> all dynamic).
    // NB: It is crucial to use stable sort to make sure that relative
    //     positions of resources are preserved.
    //     std::sort may reposition equal elements differently depending on
    //     the original arrangement, e.g.:
    //          B1 B2 A1 A2 -> A1 A2 B1 B2
    //          A1 B1 A2 B2 -> A2 A1 B2 B1
    std::stable_sort(pResources, pResources + SrcDesc.NumResources,
                     [](const PipelineResourceDesc& lhs, const PipelineResourceDesc& rhs) {
                         return lhs.VarType < rhs.VarType;
                     });

    for (size_t i = 1; i < ResourceOffsets.size(); ++i)
        ResourceOffsets[i] += ResourceOffsets[i - 1];

    for (Uint32 i = 0; i < SrcDesc.NumImmutableSamplers; ++i)
    {
        const ImmutableSamplerDesc& SrcSam = SrcDesc.ImmutableSamplers[i];
        ImmutableSamplerDesc&       DstSam = pSamplers[i];

        DstSam = SrcSam;
        VERIFY_EXPR(SrcSam.SamplerOrTextureName != nullptr && SrcSam.SamplerOrTextureName[0] != '\0');
        DstSam.SamplerOrTextureName = Allocator.CopyString(SrcSam.SamplerOrTextureName);
        DstSam.Desc.Name            = Allocator.CopyString(SrcSam.Desc.Name);
        if (!DstSam.Desc.Name)
            DstSam.Desc.Name = "";
    }

    DstDesc.Resources         = pResources;
    DstDesc.ImmutableSamplers = pSamplers;

    if (SrcDesc.UseCombinedTextureSamplers)
        DstDesc.CombinedSamplerSuffix = Allocator.CopyString(SrcDesc.CombinedSamplerSuffix);
}